

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

size_t __thiscall clickhouse::ArrayInput::DoNext(ArrayInput *this,void **ptr,size_t len)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  puVar1 = this->data_;
  uVar2 = this->len_;
  if (uVar2 < len) {
    len = uVar2;
  }
  *ptr = puVar1;
  this->len_ = uVar2 - len;
  this->data_ = puVar1 + len;
  return len;
}

Assistant:

size_t ArrayInput::DoNext(const void** ptr, size_t len) {
    len = std::min(len_, len);

    *ptr   = data_;
    len_  -= len;
    data_ += len;

    return len;
}